

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void __thiscall CTcGenTarg::linker_ensure_mod_obj(CTcGenTarg *this,CTcSymMetaclass *mc)

{
  CTcSymObj *pCVar1;
  CTcSymObjBase *this_00;
  CTcSymMetaclassBase *in_RSI;
  tct3_tadsobj_ctx obj_ctx;
  CTcSymObj *mod_sym;
  int in_stack_00000054;
  vm_obj_id_t in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc4;
  CTcGenTarg *ctx;
  CTcGenTarg *this_01;
  uint in_stack_ffffffffffffffe0;
  
  pCVar1 = CTcSymMetaclassBase::get_mod_obj(in_RSI);
  if (pCVar1 == (CTcSymObj *)0x0) {
    this_00 = &CTcSymObjBase::synthesize_modified_obj_sym(in_stack_00000054)->super_CTcSymObjBase;
    CTcSymObjBase::set_metaclass(this_00,TC_META_ICMOD);
    CTcSymMetaclassBase::set_mod_obj(in_RSI,(CTcSymObj *)this_00);
    ctx = G_cg;
    this_01 = (CTcGenTarg *)G_icmod_stream;
    CTcSymObjBase::get_obj_id(this_00);
    open_tadsobj(this_01,(tct3_tadsobj_ctx *)ctx,
                 (CTcDataStream *)((ulong)in_stack_ffffffffffffffc4 << 0x20),
                 in_stack_ffffffffffffffbc,0,0,in_stack_ffffffffffffffe0,(uint)this_00);
    close_tadsobj(this_01,(tct3_tadsobj_ctx *)ctx);
  }
  return;
}

Assistant:

void CTcGenTarg::linker_ensure_mod_obj(CTcSymMetaclass *mc)
{
    /* if there's no modifier object, create one */
    if (mc->get_mod_obj() == 0)
    {
        /* create a modifier object */
        CTcSymObj *mod_sym = CTcSymObj::synthesize_modified_obj_sym(FALSE);

        /* set it to be an IntrinsicClassModifier object */
        mod_sym->set_metaclass(TC_META_ICMOD);

        /* link the modifier to the metaclass */
        mc->set_mod_obj(mod_sym);
        
        /* 
         *   generate the object data - this is simply an empty object with
         *   no superclasses, and it goes in the intrinsic class modifier
         *   stream 
         */
        tct3_tadsobj_ctx obj_ctx;
        G_cg->open_tadsobj(
            &obj_ctx, G_icmod_stream,
            mod_sym->get_obj_id(), 0, 0, 0, 0);
        G_cg->close_tadsobj(&obj_ctx);
    }
}